

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileDrainer.cpp
# Opt level: O1

OutputFile __thiscall
adios2::burstbuffer::FileDrainer::GetFileForWrite(FileDrainer *this,string *path,bool append)

{
  _Base_ptr p_Var1;
  iterator iVar2;
  bool in_CL;
  undefined7 in_register_00000011;
  key_type *__k;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  OutputFile *f;
  FileDrainer *this_00;
  OutputFile OVar4;
  undefined1 local_29;
  
  __k = (key_type *)CONCAT71(in_register_00000011,append);
  this_00 = (FileDrainer *)(path[5].field_2._M_local_buf + 8);
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>_>_>_>
                  *)this_00,__k);
  if (iVar2._M_node == (_Base_ptr)(path + 6)) {
    this->_vptr_FileDrainer = (_func_int **)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<std::ofstream,std::allocator<std::ofstream>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->operations,
               (basic_ofstream<char,_std::char_traits<char>_> **)this,
               (allocator<std::basic_ofstream<char,_std::char_traits<char>_>_> *)&local_29);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<std::ofstream>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<std::ofstream>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<std::ofstream>>>>
    ::_M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<std::ofstream>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<std::ofstream>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<std::ofstream>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<std::ofstream>>>>
                *)this_00,__k,
               (shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_> *)this);
    Open(this_00,(OutputFile *)this,__k,in_CL);
    _Var3._M_pi = extraout_RDX_00;
  }
  else {
    this->_vptr_FileDrainer = *(_func_int ***)(iVar2._M_node + 2);
    p_Var1 = iVar2._M_node[2]._M_parent;
    (this->operations).c.
    super__Deque_base<adios2::burstbuffer::FileDrainOperation,_std::allocator<adios2::burstbuffer::FileDrainOperation>_>
    ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)p_Var1;
    _Var3._M_pi = extraout_RDX;
    if (p_Var1 != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&p_Var1->_M_parent = *(int *)&p_Var1->_M_parent + 1;
        UNLOCK();
      }
      else {
        *(int *)&p_Var1->_M_parent = *(int *)&p_Var1->_M_parent + 1;
      }
    }
  }
  OVar4.
  super___shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var3._M_pi;
  OVar4.
  super___shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (OutputFile)
         OVar4.
         super___shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

OutputFile FileDrainer::GetFileForWrite(const std::string &path, bool append)
{
    auto it = m_OutputFileMap.find(path);
    if (it != m_OutputFileMap.end())
    {
        return it->second;
    }
    else
    {
        OutputFile f = std::make_shared<std::ofstream>();
        m_OutputFileMap.emplace(path, f);
        Open(f, path, append);
        return f;
    }
}